

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O2

int zip_entry_finalize(zip_t *zip,zip_entry_mark_t *entry_mark,size_t n)

{
  ulong uVar1;
  void *__ptr;
  size_t sVar2;
  void *__ptr_00;
  size_t sVar3;
  long lVar4;
  int iVar5;
  size_t sVar6;
  zip_entry_mark_t *pzVar7;
  bool bVar8;
  
  __ptr = calloc(n,8);
  if (__ptr == (void *)0x0) {
    iVar5 = -0x15;
  }
  else {
    for (sVar2 = 0; sVar2 != n; sVar2 = sVar2 + 1) {
      uVar1 = entry_mark[sVar2].m_local_header_ofs;
      *(ulong *)((long)__ptr + sVar2 * 8) = uVar1;
      sVar6 = sVar2;
      do {
        sVar3 = sVar6;
        if ((long)sVar3 < 1) {
          sVar3 = 0;
          break;
        }
        sVar6 = sVar3 - 1;
      } while (uVar1 <= *(ulong *)((long)__ptr + sVar3 * 8 + -8));
      sVar6 = sVar2;
      if (sVar3 != sVar2) {
        for (; (long)sVar3 < (long)sVar6; sVar6 = sVar6 - 1) {
          *(undefined8 *)((long)__ptr + sVar6 * 8) = *(undefined8 *)((long)__ptr + sVar6 * 8 + -8);
        }
        *(ulong *)((long)__ptr + sVar3 * 8) = uVar1;
        sVar6 = sVar2;
        pzVar7 = entry_mark;
        while (bVar8 = sVar6 != 0, sVar6 = sVar6 - 1, bVar8) {
          if ((long)sVar3 <= pzVar7->file_index) {
            pzVar7->file_index = pzVar7->file_index + 1;
          }
          pzVar7 = pzVar7 + 1;
        }
        entry_mark[sVar3].file_index = sVar2;
      }
      entry_mark[sVar2].file_index = sVar3;
    }
    __ptr_00 = calloc(n,8);
    if (__ptr_00 == (void *)0x0) {
      iVar5 = -0x15;
    }
    else {
      for (lVar4 = 0; n - 1 != lVar4; lVar4 = lVar4 + 1) {
        *(long *)((long)__ptr_00 + lVar4 * 8) =
             *(long *)((long)__ptr + lVar4 * 8 + 8) - *(long *)((long)__ptr + lVar4 * 8);
      }
      *(mz_uint64 *)((long)__ptr_00 + n * 8 + -8) =
           (zip->archive).m_archive_size - *(long *)((long)__ptr + n * 8 + -8);
      while (bVar8 = n != 0, n = n - 1, bVar8) {
        entry_mark->lf_length = *(size_t *)((long)__ptr_00 + entry_mark->file_index * 8);
        entry_mark = entry_mark + 1;
      }
      free(__ptr_00);
      iVar5 = 0;
    }
    free(__ptr);
  }
  return iVar5;
}

Assistant:

static int zip_entry_finalize(struct zip_t *zip,
                              struct zip_entry_mark_t *entry_mark,
                              const size_t n) {
  size_t i = 0;
  mz_uint64 *local_header_ofs_array = (mz_uint64 *)calloc(n, sizeof(mz_uint64));
  if (!local_header_ofs_array) {
    return ZIP_EOOMEM;
  }

  for (i = 0; i < n; ++i) {
    local_header_ofs_array[i] = entry_mark[i].m_local_header_ofs;
    ssize_t index = zip_sort(local_header_ofs_array, i);

    if ((size_t)index != i) {
      zip_index_update(entry_mark, i, index);
    }
    entry_mark[i].file_index = index;
  }

  size_t *length = (size_t *)calloc(n, sizeof(size_t));
  if (!length) {
    CLEANUP(local_header_ofs_array);
    return ZIP_EOOMEM;
  }
  for (i = 0; i < n - 1; i++) {
    length[i] =
        (size_t)(local_header_ofs_array[i + 1] - local_header_ofs_array[i]);
  }
  length[n - 1] =
      (size_t)(zip->archive.m_archive_size - local_header_ofs_array[n - 1]);

  for (i = 0; i < n; i++) {
    entry_mark[i].lf_length = length[entry_mark[i].file_index];
  }

  CLEANUP(length);
  CLEANUP(local_header_ofs_array);
  return 0;
}